

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

stbtt_int32
stbtt__CompareUTF8toUTF16_bigendian_prefix
          (stbtt_uint8 *s1,stbtt_int32 len1,stbtt_uint8 *s2,stbtt_int32 len2)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  iVar4 = 0;
  do {
    if (len2 == 0) {
      return iVar4;
    }
    bVar1 = *s2;
    uVar2 = CONCAT11(bVar1,s2[1]);
    uVar7 = (uint)uVar2;
    if (uVar7 < 0x80) {
      if ((len1 <= iVar4) || (lVar6 = (long)iVar4, iVar4 = iVar4 + 1, uVar7 != s1[lVar6]))
      goto LAB_00197f07;
LAB_0019805c:
      s2 = s2 + 2;
      len2 = len2 + -2;
      bVar3 = true;
    }
    else {
      lVar6 = (long)iVar4;
      if (bVar1 < 8) {
        iVar5 = (int)(lVar6 + 1);
        if (iVar5 < len1) {
          if ((ushort)(uVar2 >> 6 | 0xc0) != (ushort)s1[lVar6]) {
            iVar4 = iVar5;
            bVar3 = false;
            goto LAB_00198066;
          }
          iVar4 = iVar4 + 2;
          bVar1 = s1[lVar6 + 1];
LAB_00197ef3:
          if ((s2[1] & 0x3f | 0x80) == bVar1) goto LAB_0019805c;
        }
      }
      else {
        if ((bVar1 & 0xfc) != 0xd8) {
          bVar3 = false;
          if ((bVar1 & 0xfc) != 0xdc) {
            iVar5 = (int)(lVar6 + 2);
            bVar3 = false;
            if (iVar5 < len1) {
              if ((byte)(bVar1 >> 4 | 0xe0) == s1[lVar6]) {
                if ((uVar2 >> 6 & 0x3f | 0x80) == (ushort)s1[lVar6 + 1]) {
                  iVar4 = iVar4 + 3;
                  bVar1 = s1[lVar6 + 2];
                  goto LAB_00197ef3;
                }
                bVar3 = false;
                iVar4 = iVar5;
              }
              else {
                bVar3 = false;
                iVar4 = (int)(lVar6 + 1);
              }
            }
          }
          goto LAB_00198066;
        }
        iVar5 = (int)(lVar6 + 3);
        if (iVar5 < len1) {
          uVar7 = uVar7 * 0x400 + (uint)CONCAT11(s2[2],s2[3]) + 0xfca02400;
          if ((uVar7 >> 0x12) + 0xf0 == (uint)s1[lVar6]) {
            if ((uVar7 >> 0xc & 0x3f | 0x80) == (uint)s1[lVar6 + 1]) {
              if ((uVar7 >> 6 & 0x3f | 0x80) == (uint)s1[lVar6 + 2]) {
                iVar4 = iVar4 + 4;
                if ((s2[3] & 0x3f | 0x80) != s1[lVar6 + 3]) goto LAB_00198022;
                s2 = s2 + 2;
                len2 = len2 + -2;
                bVar3 = true;
              }
              else {
                bVar3 = false;
                iVar4 = iVar5;
              }
            }
            else {
              bVar3 = false;
              iVar4 = (int)(lVar6 + 2);
            }
          }
          else {
            bVar3 = false;
            iVar4 = (int)(lVar6 + 1);
          }
        }
        else {
LAB_00198022:
          bVar3 = false;
        }
        if (bVar3) goto LAB_0019805c;
      }
LAB_00197f07:
      bVar3 = false;
    }
LAB_00198066:
    if (!bVar3) {
      return -1;
    }
  } while( true );
}

Assistant:

static stbtt_int32 stbtt__CompareUTF8toUTF16_bigendian_prefix(stbtt_uint8 *s1, stbtt_int32 len1, stbtt_uint8 *s2, stbtt_int32 len2)
{
   stbtt_int32 i=0;

   // convert utf16 to utf8 and compare the results while converting
   while (len2) {
      stbtt_uint16 ch = s2[0]*256 + s2[1];
      if (ch < 0x80) {
         if (i >= len1) return -1;
         if (s1[i++] != ch) return -1;
      } else if (ch < 0x800) {
         if (i+1 >= len1) return -1;
         if (s1[i++] != 0xc0 + (ch >> 6)) return -1;
         if (s1[i++] != 0x80 + (ch & 0x3f)) return -1;
      } else if (ch >= 0xd800 && ch < 0xdc00) {
         stbtt_uint32 c;
         stbtt_uint16 ch2 = s2[2]*256 + s2[3];
         if (i+3 >= len1) return -1;
         c = ((ch - 0xd800) << 10) + (ch2 - 0xdc00) + 0x10000;
         if (s1[i++] != 0xf0 + (c >> 18)) return -1;
         if (s1[i++] != 0x80 + ((c >> 12) & 0x3f)) return -1;
         if (s1[i++] != 0x80 + ((c >>  6) & 0x3f)) return -1;
         if (s1[i++] != 0x80 + ((c      ) & 0x3f)) return -1;
         s2 += 2; // plus another 2 below
         len2 -= 2;
      } else if (ch >= 0xdc00 && ch < 0xe000) {
         return -1;
      } else {
         if (i+2 >= len1) return -1;
         if (s1[i++] != 0xe0 + (ch >> 12)) return -1;
         if (s1[i++] != 0x80 + ((ch >> 6) & 0x3f)) return -1;
         if (s1[i++] != 0x80 + ((ch     ) & 0x3f)) return -1;
      }
      s2 += 2;
      len2 -= 2;
   }
   return i;
}